

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

void Fossilize::DestroyDevice(VkDevice device,VkAllocationCallbacks *pAllocator)

{
  key_type pvVar1;
  int iVar2;
  const_iterator cVar3;
  iterator __it;
  key_type local_30;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)globalLock);
  if (iVar2 == 0) {
    pvVar1 = *(key_type *)device;
    local_30 = pvVar1;
    cVar3 = std::
            _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)deviceData,&local_30);
    (**(code **)(*(long *)(*(long *)((long)cVar3.
                                           super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_false>
                                           ._M_cur + 0x10) + 0x18) + 8))(device,pAllocator);
    local_30 = pvVar1;
    __it = std::
           _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)deviceData,&local_30);
    std::
    _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)deviceData,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_false>
            ._M_cur);
    pthread_mutex_unlock((pthread_mutex_t *)globalLock);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

static VKAPI_ATTR void VKAPI_CALL DestroyDevice(VkDevice device, const VkAllocationCallbacks *pAllocator)
{
	lock_guard<mutex> holder{ globalLock };

	void *key = getDispatchKey(device);
	auto *layer = getLayerData(key, deviceData);

	layer->getTable()->DestroyDevice(device, pAllocator);
	destroyLayerData(key, deviceData);
}